

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void fadst4x8_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  char in_DL;
  longlong *in_RSI;
  undefined8 *in_RDI;
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  __m128i __rounding_04;
  __m128i __rounding_05;
  __m128i __rounding_06;
  __m128i __rounding_07;
  __m128i x6 [8];
  __m128i x5 [8];
  __m128i x4 [8];
  __m128i x3 [8];
  __m128i x2 [8];
  __m128i x1 [8];
  __m128i cospi_p12_m52;
  __m128i cospi_p52_p12;
  __m128i cospi_p28_m36;
  __m128i cospi_p36_p28;
  __m128i cospi_p44_m20;
  __m128i cospi_p20_p44;
  __m128i cospi_p60_m04;
  __m128i cospi_p04_p60;
  __m128i cospi_m48_p16;
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i __rounding;
  __m128i __zero;
  int32_t *cospi;
  __m128i *in_stack_fffffffffffff750;
  __m128i *in_stack_fffffffffffff758;
  longlong lStack_8a0;
  longlong local_898;
  longlong lStack_890;
  longlong local_888;
  longlong lStack_880;
  longlong local_878;
  longlong lStack_870;
  longlong local_868;
  longlong lStack_860;
  longlong local_858;
  longlong lStack_850;
  longlong local_848;
  longlong lStack_840;
  longlong local_838;
  longlong lStack_830;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [16];
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  longlong local_768;
  longlong lStack_760;
  longlong local_758;
  longlong lStack_750;
  longlong local_748;
  longlong lStack_740;
  longlong local_738;
  longlong lStack_730;
  undefined1 local_728 [16];
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  longlong local_688;
  longlong lStack_680;
  longlong local_678;
  longlong lStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  longlong local_648;
  longlong lStack_640;
  longlong local_638;
  longlong lStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined1 local_5e8 [16];
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined1 local_5b8 [16];
  longlong local_5a8;
  longlong lStack_5a0;
  longlong local_598;
  longlong lStack_590;
  longlong local_588;
  longlong lStack_580;
  longlong local_578;
  longlong lStack_570;
  longlong local_568;
  longlong lStack_560;
  longlong local_558;
  longlong lStack_550;
  longlong local_548;
  longlong lStack_540;
  longlong local_538;
  longlong lStack_530;
  longlong local_528;
  longlong lStack_520;
  longlong local_518;
  longlong lStack_510;
  longlong local_508;
  longlong lStack_500;
  longlong local_4f8;
  longlong lStack_4f0;
  longlong local_4e8;
  longlong lStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  int32_t *local_4b0;
  char local_4a1;
  longlong *local_4a0;
  undefined8 *local_498;
  int local_490;
  uint local_48c;
  int local_488;
  uint local_484;
  int local_480;
  uint local_47c;
  int local_478;
  uint local_474;
  uint local_470;
  int local_46c;
  uint local_468;
  int local_464;
  undefined4 local_460;
  int local_45c;
  longlong local_458;
  longlong lStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  longlong local_438;
  longlong lStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  longlong local_418;
  longlong lStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  longlong local_3f8;
  longlong lStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  longlong local_3d8;
  longlong lStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  longlong local_3b8;
  longlong lStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  longlong local_398;
  longlong lStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  longlong local_378;
  longlong lStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  longlong local_358;
  longlong lStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  longlong local_338;
  longlong lStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  longlong local_318;
  longlong lStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  longlong local_2f8;
  longlong lStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  longlong local_2d8;
  longlong lStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  longlong local_2b8;
  longlong lStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  longlong local_298;
  longlong lStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  longlong local_278;
  longlong lStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  longlong local_1b8;
  longlong lStack_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  longlong local_198;
  longlong lStack_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  longlong local_178;
  longlong lStack_170;
  uint local_168;
  uint local_164;
  uint local_160;
  uint local_15c;
  longlong local_158;
  longlong lStack_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  longlong local_138;
  longlong lStack_130;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  longlong local_118;
  longlong lStack_110;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  longlong local_f8;
  longlong lStack_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  longlong local_d8;
  longlong lStack_d0;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  longlong local_b8;
  longlong lStack_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  longlong local_98;
  longlong lStack_90;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  longlong local_78;
  longlong lStack_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  longlong local_58;
  longlong lStack_50;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  longlong local_38;
  longlong lStack_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_4a1 = in_DL;
  local_4a0 = in_RSI;
  local_498 = in_RDI;
  local_4b0 = cospi_arr((int)in_DL);
  local_18 = 0;
  uStack_10 = 0;
  local_4c8 = 0;
  uStack_4c0 = 0;
  local_45c = 1 << (local_4a1 - 1U & 0x1f);
  local_4d8 = CONCAT44(local_45c,local_45c);
  uStack_4d0 = CONCAT44(local_45c,local_45c);
  local_460 = CONCAT22((short)local_4b0[0x20],(short)local_4b0[0x20]);
  local_4e8 = CONCAT44(local_460,local_460);
  lStack_4e0 = CONCAT44(local_460,local_460);
  local_464 = (local_4b0[0x20] & 0xffffU) + local_4b0[0x20] * -0x10000;
  local_4f8 = CONCAT44(local_464,local_464);
  lStack_4f0 = CONCAT44(local_464,local_464);
  local_468 = (uint)*(ushort *)(local_4b0 + 0x10) | local_4b0[0x30] << 0x10;
  local_508 = CONCAT44(local_468,local_468);
  lStack_500 = CONCAT44(local_468,local_468);
  local_46c = (uint)*(ushort *)(local_4b0 + 0x30) + local_4b0[0x10] * -0x10000;
  local_518 = CONCAT44(local_46c,local_46c);
  lStack_510 = CONCAT44(local_46c,local_46c);
  local_470 = -local_4b0[0x30] & 0xffffU | local_4b0[0x10] << 0x10;
  local_528 = CONCAT44(local_470,local_470);
  lStack_520 = CONCAT44(local_470,local_470);
  local_474 = (uint)*(ushort *)(local_4b0 + 4) | local_4b0[0x3c] << 0x10;
  local_538 = CONCAT44(local_474,local_474);
  lStack_530 = CONCAT44(local_474,local_474);
  local_478 = (uint)*(ushort *)(local_4b0 + 0x3c) + local_4b0[4] * -0x10000;
  local_548 = CONCAT44(local_478,local_478);
  lStack_540 = CONCAT44(local_478,local_478);
  local_47c = (uint)*(ushort *)(local_4b0 + 0x14) | local_4b0[0x2c] << 0x10;
  local_558 = CONCAT44(local_47c,local_47c);
  lStack_550 = CONCAT44(local_47c,local_47c);
  local_480 = (uint)*(ushort *)(local_4b0 + 0x2c) + local_4b0[0x14] * -0x10000;
  local_568 = CONCAT44(local_480,local_480);
  lStack_560 = CONCAT44(local_480,local_480);
  local_484 = (uint)*(ushort *)(local_4b0 + 0x24) | local_4b0[0x1c] << 0x10;
  local_578 = CONCAT44(local_484,local_484);
  lStack_570 = CONCAT44(local_484,local_484);
  local_488 = (uint)*(ushort *)(local_4b0 + 0x1c) + local_4b0[0x24] * -0x10000;
  local_588 = CONCAT44(local_488,local_488);
  lStack_580 = CONCAT44(local_488,local_488);
  local_48c = (uint)*(ushort *)(local_4b0 + 0x34) | local_4b0[0xc] << 0x10;
  local_598 = CONCAT44(local_48c,local_48c);
  lStack_590 = CONCAT44(local_48c,local_48c);
  local_490 = (uint)*(ushort *)(local_4b0 + 0xc) + local_4b0[0x34] * -0x10000;
  local_5a8 = CONCAT44(local_490,local_490);
  lStack_5a0 = CONCAT44(local_490,local_490);
  local_6a8 = *local_498;
  uStack_6a0 = local_498[1];
  local_1f8 = *(undefined8 *)*(undefined1 (*) [16])(local_498 + 0xe);
  uStack_1f0 = local_498[0xf];
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_618 = psubsw(ZEXT816(0),*(undefined1 (*) [16])(local_498 + 0xe));
  local_218 = *(undefined8 *)*(undefined1 (*) [16])(local_498 + 6);
  uStack_210 = local_498[7];
  local_208 = 0;
  uStack_200 = 0;
  local_608 = psubsw(ZEXT816(0),*(undefined1 (*) [16])(local_498 + 6));
  local_5f8 = local_498[8];
  uStack_5f0 = local_498[9];
  local_238 = *(undefined8 *)*(undefined1 (*) [16])(local_498 + 2);
  uStack_230 = local_498[3];
  local_228 = 0;
  uStack_220 = 0;
  local_5e8 = psubsw(ZEXT816(0),*(undefined1 (*) [16])(local_498 + 2));
  local_5d8 = local_498[0xc];
  uStack_5d0 = local_498[0xd];
  local_5c8 = local_498[4];
  uStack_5c0 = local_498[5];
  local_258 = *(undefined8 *)*(undefined1 (*) [16])(local_498 + 10);
  uStack_250 = local_498[0xb];
  local_248 = 0;
  uStack_240 = 0;
  local_5b8 = psubsw(ZEXT816(0),*(undefined1 (*) [16])(local_498 + 10));
  local_698 = local_618._0_8_;
  uStack_690 = local_618._8_8_;
  __rounding_00[1] = local_608;
  __rounding_00[0] = (ulong)(uint)(int)local_4a1;
  local_628 = local_6a8;
  uStack_620 = uStack_6a0;
  local_1d8 = local_4d8;
  uStack_1d0 = uStack_4d0;
  local_1c8 = local_45c;
  local_1c4 = local_45c;
  local_1c0 = local_45c;
  local_1bc = local_45c;
  local_1b8 = local_4e8;
  lStack_1b0 = lStack_4e0;
  local_1a8 = local_460;
  local_1a4 = local_460;
  local_1a0 = local_460;
  local_19c = local_460;
  local_198 = local_4f8;
  lStack_190 = lStack_4f0;
  local_188 = local_464;
  local_184 = local_464;
  local_180 = local_464;
  local_17c = local_464;
  local_178 = local_508;
  lStack_170 = lStack_500;
  local_168 = local_468;
  local_164 = local_468;
  local_160 = local_468;
  local_15c = local_468;
  local_158 = local_518;
  lStack_150 = lStack_510;
  local_148 = local_46c;
  local_144 = local_46c;
  local_140 = local_46c;
  local_13c = local_46c;
  local_138 = local_528;
  lStack_130 = lStack_520;
  local_128 = local_470;
  local_124 = local_470;
  local_120 = local_470;
  local_11c = local_470;
  local_118 = local_538;
  lStack_110 = lStack_530;
  local_108 = local_474;
  local_104 = local_474;
  local_100 = local_474;
  local_fc = local_474;
  local_f8 = local_548;
  lStack_f0 = lStack_540;
  local_e8 = local_478;
  local_e4 = local_478;
  local_e0 = local_478;
  local_dc = local_478;
  local_d8 = local_558;
  lStack_d0 = lStack_550;
  local_c8 = local_47c;
  local_c4 = local_47c;
  local_c0 = local_47c;
  local_bc = local_47c;
  local_b8 = local_568;
  lStack_b0 = lStack_560;
  local_a8 = local_480;
  local_a4 = local_480;
  local_a0 = local_480;
  local_9c = local_480;
  local_98 = local_578;
  lStack_90 = lStack_570;
  local_88 = local_484;
  local_84 = local_484;
  local_80 = local_484;
  local_7c = local_484;
  local_78 = local_588;
  lStack_70 = lStack_580;
  local_68 = local_488;
  local_64 = local_488;
  local_60 = local_488;
  local_5c = local_488;
  local_58 = local_598;
  lStack_50 = lStack_590;
  local_48 = local_48c;
  local_44 = local_48c;
  local_40 = local_48c;
  local_3c = local_48c;
  local_38 = local_5a8;
  lStack_30 = lStack_5a0;
  local_28 = local_490;
  local_24 = local_490;
  local_20 = local_490;
  local_1c = local_490;
  btf_16_w4_sse2((__m128i *)&local_4e8,(__m128i *)&local_4f8,__rounding_00,(char)&local_628 + '0',
                 (__m128i *)&local_688,(__m128i *)&local_678,in_stack_fffffffffffff750,
                 in_stack_fffffffffffff758);
  local_668 = local_5e8._0_8_;
  uStack_660 = local_5e8._8_8_;
  local_658 = local_5d8;
  uStack_650 = uStack_5d0;
  __rounding_01[1] = &local_5c8;
  __rounding_01[0] = (ulong)(uint)(int)local_4a1;
  btf_16_w4_sse2((__m128i *)&local_4e8,(__m128i *)&local_4f8,__rounding_01,(char)&local_628 + 'p',
                 (__m128i *)&local_648,(__m128i *)&local_638,in_stack_fffffffffffff750,
                 in_stack_fffffffffffff758);
  local_368 = local_6a8;
  uStack_360 = uStack_6a0;
  local_378 = local_688;
  lStack_370 = lStack_680;
  auVar16._8_8_ = uStack_6a0;
  auVar16._0_8_ = local_6a8;
  auVar15._8_8_ = lStack_680;
  auVar15._0_8_ = local_688;
  local_728 = paddsw(auVar16,auVar15);
  local_268 = local_6a8;
  uStack_260 = uStack_6a0;
  local_278 = local_688;
  lStack_270 = lStack_680;
  auVar32._8_8_ = uStack_6a0;
  auVar32._0_8_ = local_6a8;
  auVar31._8_8_ = lStack_680;
  auVar31._0_8_ = local_688;
  local_708 = psubsw(auVar32,auVar31);
  local_388 = local_698;
  uStack_380 = uStack_690;
  local_398 = local_678;
  lStack_390 = lStack_670;
  auVar14._8_8_ = uStack_690;
  auVar14._0_8_ = local_698;
  auVar13._8_8_ = lStack_670;
  auVar13._0_8_ = local_678;
  local_718 = paddsw(auVar14,auVar13);
  local_288 = local_698;
  uStack_280 = uStack_690;
  local_298 = local_678;
  lStack_290 = lStack_670;
  auVar30._8_8_ = uStack_690;
  auVar30._0_8_ = local_698;
  auVar29._8_8_ = lStack_670;
  auVar29._0_8_ = local_678;
  local_6f8 = psubsw(auVar30,auVar29);
  local_3a8 = local_668;
  uStack_3a0 = uStack_660;
  local_3b8 = local_648;
  lStack_3b0 = lStack_640;
  auVar12._8_8_ = uStack_660;
  auVar12._0_8_ = local_668;
  auVar11._8_8_ = lStack_640;
  auVar11._0_8_ = local_648;
  local_6e8 = paddsw(auVar12,auVar11);
  local_2a8 = local_668;
  uStack_2a0 = uStack_660;
  local_2b8 = local_648;
  lStack_2b0 = lStack_640;
  auVar28._8_8_ = uStack_660;
  auVar28._0_8_ = local_668;
  auVar27._8_8_ = lStack_640;
  auVar27._0_8_ = local_648;
  local_6c8 = psubsw(auVar28,auVar27);
  local_3c8 = local_658;
  uStack_3c0 = uStack_650;
  local_3d8 = local_638;
  lStack_3d0 = lStack_630;
  auVar10._8_8_ = uStack_650;
  auVar10._0_8_ = local_658;
  auVar9._8_8_ = lStack_630;
  auVar9._0_8_ = local_638;
  local_6d8 = paddsw(auVar10,auVar9);
  local_2c8 = local_658;
  uStack_2c0 = uStack_650;
  local_2d8 = local_638;
  lStack_2d0 = lStack_630;
  auVar26._8_8_ = uStack_650;
  auVar26._0_8_ = local_658;
  auVar25._8_8_ = lStack_630;
  auVar25._0_8_ = local_638;
  local_6b8 = psubsw(auVar26,auVar25);
  local_7a8 = local_728._0_8_;
  uStack_7a0 = local_728._8_8_;
  local_798 = local_718._0_8_;
  uStack_790 = local_718._8_8_;
  local_788 = local_708._0_8_;
  uStack_780 = local_708._8_8_;
  local_778 = local_6f8._0_8_;
  uStack_770 = local_6f8._8_8_;
  __rounding_02[1] = local_6e8;
  __rounding_02[0] = (ulong)(uint)(int)local_4a1;
  btf_16_w4_sse2((__m128i *)&local_508,(__m128i *)&local_518,__rounding_02,(char)local_728 + 'P',
                 (__m128i *)&local_768,(__m128i *)&local_758,in_stack_fffffffffffff750,
                 in_stack_fffffffffffff758);
  __rounding_03[1] = local_6c8;
  __rounding_03[0] = (ulong)(uint)(int)local_4a1;
  btf_16_w4_sse2((__m128i *)&local_528,(__m128i *)&local_508,__rounding_03,(char)local_728 + 'p',
                 (__m128i *)&local_748,(__m128i *)&local_738,in_stack_fffffffffffff750,
                 in_stack_fffffffffffff758);
  local_3e8 = local_7a8;
  uStack_3e0 = uStack_7a0;
  local_3f8 = local_768;
  lStack_3f0 = lStack_760;
  auVar8._8_8_ = uStack_7a0;
  auVar8._0_8_ = local_7a8;
  auVar7._8_8_ = lStack_760;
  auVar7._0_8_ = local_768;
  local_828 = paddsw(auVar8,auVar7);
  local_2e8 = local_7a8;
  uStack_2e0 = uStack_7a0;
  local_2f8 = local_768;
  lStack_2f0 = lStack_760;
  auVar24._8_8_ = uStack_7a0;
  auVar24._0_8_ = local_7a8;
  auVar23._8_8_ = lStack_760;
  auVar23._0_8_ = local_768;
  local_7e8 = psubsw(auVar24,auVar23);
  local_408 = local_798;
  uStack_400 = uStack_790;
  local_418 = local_758;
  lStack_410 = lStack_750;
  auVar6._8_8_ = uStack_790;
  auVar6._0_8_ = local_798;
  auVar5._8_8_ = lStack_750;
  auVar5._0_8_ = local_758;
  local_818 = paddsw(auVar6,auVar5);
  local_308 = local_798;
  uStack_300 = uStack_790;
  local_318 = local_758;
  lStack_310 = lStack_750;
  auVar22._8_8_ = uStack_790;
  auVar22._0_8_ = local_798;
  auVar21._8_8_ = lStack_750;
  auVar21._0_8_ = local_758;
  local_7d8 = psubsw(auVar22,auVar21);
  local_428 = local_788;
  uStack_420 = uStack_780;
  local_438 = local_748;
  lStack_430 = lStack_740;
  auVar4._8_8_ = uStack_780;
  auVar4._0_8_ = local_788;
  auVar3._8_8_ = lStack_740;
  auVar3._0_8_ = local_748;
  local_808 = paddsw(auVar4,auVar3);
  local_328 = local_788;
  uStack_320 = uStack_780;
  local_338 = local_748;
  lStack_330 = lStack_740;
  auVar20._8_8_ = uStack_780;
  auVar20._0_8_ = local_788;
  auVar19._8_8_ = lStack_740;
  auVar19._0_8_ = local_748;
  local_7c8 = psubsw(auVar20,auVar19);
  local_448 = local_778;
  uStack_440 = uStack_770;
  local_458 = local_738;
  lStack_450 = lStack_730;
  auVar2._8_8_ = uStack_770;
  auVar2._0_8_ = local_778;
  auVar1._8_8_ = lStack_730;
  auVar1._0_8_ = local_738;
  local_7f8 = paddsw(auVar2,auVar1);
  local_348 = local_778;
  uStack_340 = uStack_770;
  local_358 = local_738;
  lStack_350 = lStack_730;
  auVar18._8_8_ = uStack_770;
  auVar18._0_8_ = local_778;
  auVar17._8_8_ = lStack_730;
  auVar17._0_8_ = local_738;
  local_7b8 = psubsw(auVar18,auVar17);
  __rounding_04[0] = (ulong)(uint)(int)local_4a1;
  __rounding_04[1] = (longlong)local_828;
  btf_16_w4_sse2((__m128i *)&local_538,(__m128i *)&local_548,__rounding_04,(char)local_828 + '\x10',
                 (__m128i *)&stack0xfffffffffffff758,(__m128i *)&local_898,in_stack_fffffffffffff750
                 ,in_stack_fffffffffffff758);
  __rounding_05[1] = local_808;
  __rounding_05[0] = (ulong)(uint)(int)local_4a1;
  btf_16_w4_sse2((__m128i *)&local_558,(__m128i *)&local_568,__rounding_05,(char)local_828 + '0',
                 (__m128i *)&local_888,(__m128i *)&local_878,in_stack_fffffffffffff750,
                 in_stack_fffffffffffff758);
  __rounding_06[1] = local_7e8;
  __rounding_06[0] = (ulong)(uint)(int)local_4a1;
  btf_16_w4_sse2((__m128i *)&local_578,(__m128i *)&local_588,__rounding_06,(char)local_828 + 'P',
                 (__m128i *)&local_868,(__m128i *)&local_858,in_stack_fffffffffffff750,
                 in_stack_fffffffffffff758);
  __rounding_07[1] = local_7c8;
  __rounding_07[0] = (ulong)(uint)(int)local_4a1;
  btf_16_w4_sse2((__m128i *)&local_598,(__m128i *)&local_5a8,__rounding_07,(char)local_828 + 'p',
                 (__m128i *)&local_848,(__m128i *)&local_838,in_stack_fffffffffffff750,
                 in_stack_fffffffffffff758);
  *local_4a0 = local_898;
  local_4a0[1] = lStack_890;
  local_4a0[2] = local_848;
  local_4a0[3] = lStack_840;
  local_4a0[4] = local_878;
  local_4a0[5] = lStack_870;
  local_4a0[6] = local_868;
  local_4a0[7] = lStack_860;
  local_4a0[8] = local_858;
  local_4a0[9] = lStack_850;
  local_4a0[10] = local_888;
  local_4a0[0xb] = lStack_880;
  local_4a0[0xc] = local_838;
  local_4a0[0xd] = lStack_830;
  local_4a0[0xe] = (longlong)in_stack_fffffffffffff758;
  local_4a0[0xf] = lStack_8a0;
  return;
}

Assistant:

static void fadst4x8_new_sse2(const __m128i *input, __m128i *output,
                              int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);

  // stage 1
  __m128i x1[8];
  x1[0] = input[0];
  x1[1] = _mm_subs_epi16(__zero, input[7]);
  x1[2] = _mm_subs_epi16(__zero, input[3]);
  x1[3] = input[4];
  x1[4] = _mm_subs_epi16(__zero, input[1]);
  x1[5] = input[6];
  x1[6] = input[2];
  x1[7] = _mm_subs_epi16(__zero, input[5]);

  // stage 2
  __m128i x2[8];
  x2[0] = x1[0];
  x2[1] = x1[1];
  btf_16_w4_sse2(&cospi_p32_p32, &cospi_p32_m32, __rounding, cos_bit, &x1[2],
                 &x1[3], &x2[2], &x2[3]);
  x2[4] = x1[4];
  x2[5] = x1[5];
  btf_16_w4_sse2(&cospi_p32_p32, &cospi_p32_m32, __rounding, cos_bit, &x1[6],
                 &x1[7], &x2[6], &x2[7]);

  // stage 3
  __m128i x3[8];
  x3[0] = _mm_adds_epi16(x2[0], x2[2]);
  x3[2] = _mm_subs_epi16(x2[0], x2[2]);
  x3[1] = _mm_adds_epi16(x2[1], x2[3]);
  x3[3] = _mm_subs_epi16(x2[1], x2[3]);
  x3[4] = _mm_adds_epi16(x2[4], x2[6]);
  x3[6] = _mm_subs_epi16(x2[4], x2[6]);
  x3[5] = _mm_adds_epi16(x2[5], x2[7]);
  x3[7] = _mm_subs_epi16(x2[5], x2[7]);

  // stage 4
  __m128i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_w4_sse2(&cospi_p16_p48, &cospi_p48_m16, __rounding, cos_bit, &x3[4],
                 &x3[5], &x4[4], &x4[5]);
  btf_16_w4_sse2(&cospi_m48_p16, &cospi_p16_p48, __rounding, cos_bit, &x3[6],
                 &x3[7], &x4[6], &x4[7]);

  // stage 5
  __m128i x5[8];
  x5[0] = _mm_adds_epi16(x4[0], x4[4]);
  x5[4] = _mm_subs_epi16(x4[0], x4[4]);
  x5[1] = _mm_adds_epi16(x4[1], x4[5]);
  x5[5] = _mm_subs_epi16(x4[1], x4[5]);
  x5[2] = _mm_adds_epi16(x4[2], x4[6]);
  x5[6] = _mm_subs_epi16(x4[2], x4[6]);
  x5[3] = _mm_adds_epi16(x4[3], x4[7]);
  x5[7] = _mm_subs_epi16(x4[3], x4[7]);

  // stage 6
  __m128i x6[8];
  btf_16_w4_sse2(&cospi_p04_p60, &cospi_p60_m04, __rounding, cos_bit, &x5[0],
                 &x5[1], &x6[0], &x6[1]);
  btf_16_w4_sse2(&cospi_p20_p44, &cospi_p44_m20, __rounding, cos_bit, &x5[2],
                 &x5[3], &x6[2], &x6[3]);
  btf_16_w4_sse2(&cospi_p36_p28, &cospi_p28_m36, __rounding, cos_bit, &x5[4],
                 &x5[5], &x6[4], &x6[5]);
  btf_16_w4_sse2(&cospi_p52_p12, &cospi_p12_m52, __rounding, cos_bit, &x5[6],
                 &x5[7], &x6[6], &x6[7]);

  // stage 7
  output[0] = x6[1];
  output[1] = x6[6];
  output[2] = x6[3];
  output[3] = x6[4];
  output[4] = x6[5];
  output[5] = x6[2];
  output[6] = x6[7];
  output[7] = x6[0];
}